

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

string * __thiscall
libcellml::Variable::VariableImpl::equivalentMappingId_abi_cxx11_
          (string *__return_storage_ptr__,VariableImpl *this,VariablePtr *equivalentVariable)

{
  _Rb_tree_header *p_Var1;
  _Atomic_word *p_Var2;
  _Base_ptr p_Var3;
  pointer pcVar4;
  int iVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  bool bVar9;
  key_type local_38;
  
  p_Var3 = (_Base_ptr)
           (equivalentVariable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
  if (p_Var3 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = (_Atomic_word *)((long)&p_Var3->_M_parent + 4);
      *p_Var2 = *p_Var2 + 1;
      UNLOCK();
    }
    else {
      p_Var2 = (_Atomic_word *)((long)&p_Var3->_M_parent + 4);
      *p_Var2 = *p_Var2 + 1;
    }
  }
  p_Var1 = &(this->mMappingIdMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->mMappingIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar9]) {
    bVar9 = p_Var8[1]._M_parent < p_Var3;
    if (!bVar9) {
      p_Var6 = p_Var8;
    }
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var8 = p_Var6, p_Var3 < p_Var6[1]._M_parent)) {
    p_Var8 = &p_Var1->_M_header;
  }
  if (p_Var3 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = (_Atomic_word *)((long)&p_Var3->_M_parent + 4);
      iVar5 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar5 = *(_Atomic_word *)((long)&p_Var3->_M_parent + 4);
      *(int *)((long)&p_Var3->_M_parent + 4) = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(*(_func_int ***)&p_Var3->_M_color)[3])();
    }
  }
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (equivalentVariable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (equivalentVariable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_weak_count + 1;
      }
    }
    pmVar7 = std::
             map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&this->mMappingIdMap,&local_38);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (pmVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + pmVar7->_M_string_length);
    if (local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &(local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar5 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar5 = (local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(local_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::VariableImpl::equivalentMappingId(const VariablePtr &equivalentVariable) const
{
    if (mMappingIdMap.find(equivalentVariable) != mMappingIdMap.end()) {
        return mMappingIdMap.at(equivalentVariable);
    }
    return "";
}